

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void printSysCROperand(MCInst *MI,uint OpNo,SStream *O)

{
  byte bVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  uint id;
  MCOperand *op;
  int64_t iVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  
  op = MCInst_getOperand(MI,OpNo);
  iVar3 = MCOperand_getImm(op);
  SStream_concat(O,"c%u",iVar3);
  h = MI->csh;
  if (h->detail != CS_OPT_OFF) {
    id = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar4 = AArch64_get_op_access(h,id);
    uVar5 = '\0';
    if (puVar4[bVar1] != 0x80) {
      uVar5 = puVar4[bVar1];
    }
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar5;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar4 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar4[0] = '@';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    iVar3 = MCOperand_getImm(op);
    pcVar2 = MI->flat_insn->detail;
    *(int64_t *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) = iVar3;
    puVar4 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar4 = *puVar4 + '\x01';
  }
  return;
}

Assistant:

static void printSysCROperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	//assert(Op.isImm() && "System instruction C[nm] operands must be immediates!");
	SStream_concat(O, "c%u", MCOperand_getImm(Op));
	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access;
		access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
		MI->ac_idx++;
#endif
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_CIMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op);
		MI->flat_insn->detail->arm64.op_count++;
	}
}